

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int ARKStepReInit(void *arkode_mem,ARKRhsFn fe,ARKRhsFn fi,realtype t0,N_Vector y0)

{
  int iVar1;
  char *msgfmt;
  undefined1 auVar2 [16];
  int iVar4;
  ulong uVar3;
  int iVar5;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepReInit",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (ark_mem->MallocDone == 0) {
      msgfmt = "Attempt to call before ARKodeInit.";
      iVar1 = -0x17;
    }
    else {
      auVar2._0_4_ = -(uint)((int)fe == 0);
      iVar4 = (int)((ulong)fe >> 0x20);
      auVar2._4_4_ = -(uint)(iVar4 == 0);
      auVar2._8_4_ = -(uint)((int)fi == 0);
      iVar5 = (int)((ulong)fi >> 0x20);
      auVar2._12_4_ = -(uint)(iVar5 == 0);
      iVar1 = movmskps(0,auVar2);
      if (iVar1 == 0xf) {
        msgfmt = "Must specify at least one of fe, fi (both NULL).";
      }
      else {
        if (y0 != (N_Vector)0x0) {
          uVar3 = ~(CONCAT44(-(uint)((int)fi == 0),-(uint)((int)fe == 0)) &
                   CONCAT44(-(uint)(iVar5 == 0),-(uint)(iVar4 == 0))) & (ulong)DAT_00706f40;
          step_mem->explicit = (int)uVar3;
          step_mem->implicit = (int)(uVar3 >> 0x20);
          step_mem->fe = fe;
          step_mem->fi = fi;
          step_mem->eRNrm = 1.0;
          iVar1 = arkInit(ark_mem,t0,y0,0);
          if (iVar1 != 0) {
            arkProcessError(ark_mem,iVar1,"ARKode::ARKStep","ARKStepReInit",
                            "Unable to reinitialize main ARKode infrastructure");
            return iVar1;
          }
          step_mem->nstlp = 0;
          step_mem->nfe = 0;
          step_mem->nfi = 0;
          step_mem->nsetups = 0;
          return 0;
        }
        msgfmt = "y0 = NULL illegal.";
      }
      iVar1 = -0x16;
    }
    arkProcessError(ark_mem,iVar1,"ARKode::ARKStep","ARKStepReInit",msgfmt);
  }
  return iVar1;
}

Assistant:

int ARKStepReInit(void* arkode_mem, ARKRhsFn fe,
                  ARKRhsFn fi, realtype t0, N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepReInit",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check that at least one of fe, fi is supplied and is to be used */
  if (fe == NULL && fi == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NULL_F);
    return(ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepReInit", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit = (fe == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit = (fi == NULL) ? SUNFALSE : SUNTRUE;

  /* Copy the input parameters into ARKode state */
  step_mem->fe = fe;
  step_mem->fi = fi;

  /* Initialize initial error norm  */
  step_mem->eRNrm = ONE;

  /* Initialize main ARKode infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ARKStep", "ARKStepReInit",
                    "Unable to reinitialize main ARKode infrastructure");
    return(retval);
  }

  /* Initialize all the counters */
  step_mem->nfe     = 0;
  step_mem->nfi     = 0;
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return(ARK_SUCCESS);
}